

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker>
helics::BrokerFactory::create
          (CoreType type,string_view brokerName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string_view message;
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char *in_RCX;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  size_t in_R8;
  __sv_type _Var5;
  shared_ptr<helics::Broker> sVar6;
  CoreType newType;
  string newName;
  shared_ptr<helics::Broker> *broker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> *this;
  element_type *peVar7;
  CoreType in_stack_ffffffffffffff1c;
  string_view in_stack_ffffffffffffff20;
  size_t local_a8;
  char *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  CoreType in_stack_ffffffffffffff9c;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  peVar7 = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffef0);
  if ((in_ESI == 0x65) ||
     (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), bVar1))
  {
    helics::core::extractCoreType(in_stack_ffffffffffffff88);
    std::tie<helics::CoreType,std::__cxx11::string>
              (&in_stack_fffffffffffffee8->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x508b00);
    bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x508b20), !bVar1)) {
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      local_a8 = _Var5._M_len;
      local_18._M_len = local_a8;
      local_a0 = _Var5._M_str;
      local_18._M_str = local_a0;
    }
  }
  makeBroker(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff20);
  peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x508bcf);
  this = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
           in_stack_fffffffffffffed8);
  (*peVar3->_vptr_Broker[10])(peVar3,this);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  uVar2 = registerBroker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if ((bool)uVar2) {
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x508cba);
    (*peVar3->_vptr_Broker[2])();
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffee0));
    sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<helics::Broker>)
           sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,(char *)peVar3)
  ;
  message._M_str = (char *)peVar7;
  message._M_len = in_R8;
  RegistrationFailure::RegistrationFailure((RegistrationFailure *)this,message);
  __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

std::shared_ptr<Broker>
    create(CoreType type, std::string_view brokerName, std::vector<std::string> args)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(args);
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    broker->configureFromVector(std::move(args));
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}